

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDrawTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::anon_unknown_0::IndexGroup::init(IndexGroup *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  undefined8 this_00;
  int extraout_EAX;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  int *piVar1;
  DrawTest *pDVar2;
  RenderContext *renderCtx;
  char *pcVar3;
  char *desc_00;
  long lVar4;
  IndexType type;
  IndexType type_00;
  Storage storage;
  bool bVar5;
  TestNode *local_300;
  TestNode *local_2f8;
  TestNode *local_2f0;
  string local_2c8;
  allocator<char> local_2a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined1 local_280 [8];
  string iterationDesc;
  int iterationNdx;
  MovePtr<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_> test;
  string local_228;
  allocator<char> local_201;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_1a0 [8];
  string desc;
  allocator<char> local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  string name;
  TestCaseGroup *group;
  IndexTest *indexTest;
  int testNdx;
  TestCaseGroup *bufferGroup;
  TestCaseGroup *unalignedUserPtrGroup;
  TestCaseGroup *userPtrGroup;
  DrawTestSpec spec;
  IndexTest tests [5];
  IndexGroup *this_local;
  
  tests[4].aligned = true;
  tests[4]._9_3_ = 0;
  tests[4].offsets[0] = -1;
  tests[3].offsets[1] = 1;
  tests[3].offsets[2] = 1;
  tests[4].storage = STORAGE_BUFFER;
  tests[4].type = INDEXTYPE_BYTE;
  tests[3].storage = STORAGE_BUFFER;
  tests[3].type = INDEXTYPE_BYTE;
  tests[3].aligned = true;
  tests[3]._9_3_ = 0;
  tests[3].offsets[0] = -1;
  tests[2].aligned = true;
  tests[2]._9_3_ = 0;
  tests[2].offsets[0] = -1;
  tests[2].offsets[1] = 1;
  tests[2].offsets[2] = 0;
  tests[1].offsets[1] = 0;
  tests[1].offsets[2] = 1;
  tests[2].storage = STORAGE_USER;
  tests[2].type = INDEXTYPE_SHORT;
  tests[1].storage = STORAGE_BUFFER;
  tests[1].type = INDEXTYPE_BYTE;
  tests[1].aligned = true;
  tests[1]._9_3_ = 0;
  tests[1].offsets[0] = -1;
  tests[0].aligned = true;
  tests[0]._9_3_ = 0;
  tests[0].offsets[0] = -1;
  tests[0].offsets[1] = 0;
  tests[0].offsets[2] = 1;
  spec.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tests[0].storage = STORAGE_BUFFER;
  tests[0].type = INDEXTYPE_BYTE;
  tests[4].offsets._4_8_ = this;
  deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)&userPtrGroup);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"user_ptr",
             "user pointer");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "unaligned_user_ptr","unaligned user pointer");
  node_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"buffer",
             "buffer");
  genBasicSpec((DrawTestSpec *)&userPtrGroup,this->m_method);
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  tcu::TestNode::addChild((TestNode *)this,node_01);
  for (indexTest._4_4_ = 0; indexTest._4_4_ < 5; indexTest._4_4_ = indexTest._4_4_ + 1) {
    lVar4 = (long)indexTest._4_4_;
    piVar1 = tests[lVar4 + -1].offsets + 1;
    if (*piVar1 == 0) {
      local_2f0 = node_00;
      if ((tests[lVar4].storage & STORAGE_BUFFER) != STORAGE_USER) {
        local_2f0 = node;
      }
      local_2f8 = local_2f0;
    }
    else {
      local_300 = node_01;
      if ((tests[lVar4].storage & STORAGE_BUFFER) == STORAGE_USER) {
        local_300 = (TestNode *)0x0;
      }
      local_2f8 = local_300;
    }
    name.field_2._8_8_ = local_2f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"index_",&local_159);
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              ((string *)((long)&desc.field_2 + 8),
               (DrawTestSpec *)(ulong)(uint)tests[lVar4 + -1].offsets[2],type);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   &local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&desc.field_2 + 8));
    std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"index ",&local_201);
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              (&local_228,(DrawTestSpec *)(ulong)(uint)tests[lVar4 + -1].offsets[2],type_00);
    std::operator+(&local_1e0,&local_200,&local_228);
    std::operator+(&local_1c0,&local_1e0," in ");
    deqp::gls::DrawTestSpec::storageToString_abi_cxx11_
              ((string *)
               &test.super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>
                .m_data.field_0x8,(DrawTestSpec *)(ulong)(uint)*piVar1,storage);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                   &local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &test.
                    super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>.
                    m_data.field_0x8);
    std::__cxx11::string::~string
              ((string *)
               &test.super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>
                .m_data.field_0x8);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    pDVar2 = (DrawTest *)operator_new(0x138);
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    renderCtx = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    desc_00 = (char *)std::__cxx11::string::c_str();
    deqp::gls::DrawTest::DrawTest(pDVar2,testCtx,renderCtx,pcVar3,desc_00);
    de::DefaultDeleter<deqp::gls::DrawTest>::DefaultDeleter
              ((DefaultDeleter<deqp::gls::DrawTest> *)(iterationDesc.field_2._M_local_buf + 0xf));
    de::details::MovePtr<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>::MovePtr
              ((MovePtr<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_> *)
               &iterationNdx,pDVar2);
    spec.primitiveCount = tests[lVar4 + -1].offsets[2];
    spec.indexType = *piVar1;
    iterationDesc.field_2._8_4_ = 0;
    while( true ) {
      this_00 = name.field_2._8_8_;
      bVar5 = false;
      if ((int)iterationDesc.field_2._8_4_ < 3) {
        bVar5 = tests[lVar4].offsets[(long)(int)iterationDesc.field_2._8_4_ + -2] != -1;
      }
      if (!bVar5) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"offset ",&local_2a1);
      de::toString<int>(&local_2c8,
                        tests[lVar4].offsets + (long)(int)iterationDesc.field_2._8_4_ + -2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                     &local_2a0,&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::allocator<char>::~allocator(&local_2a1);
      spec.drawMethod = tests[lVar4].offsets[(long)(int)iterationDesc.field_2._8_4_ + -2];
      pDVar2 = de::details::
               UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>::operator->
                         ((UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>
                           *)&iterationNdx);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      deqp::gls::DrawTest::addIteration(pDVar2,(DrawTestSpec *)&userPtrGroup,pcVar3);
      std::__cxx11::string::~string((string *)local_280);
      iterationDesc.field_2._8_4_ = iterationDesc.field_2._8_4_ + 1;
    }
    pDVar2 = de::details::MovePtr<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>::
             release((MovePtr<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_> *)
                     &iterationNdx);
    tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pDVar2);
    de::details::MovePtr<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>::~MovePtr
              ((MovePtr<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_> *)
               &iterationNdx);
    std::__cxx11::string::~string((string *)local_1a0);
    std::__cxx11::string::~string((string *)local_138);
  }
  deqp::gls::DrawTestSpec::~DrawTestSpec((DrawTestSpec *)&userPtrGroup);
  return extraout_EAX;
}

Assistant:

void IndexGroup::init (void)
{
	struct IndexTest
	{
		gls::DrawTestSpec::Storage		storage;
		gls::DrawTestSpec::IndexType	type;
		bool							aligned;
		int								offsets[3];
	};

	const IndexTest tests[] =
	{
		{ gls::DrawTestSpec::STORAGE_USER,		gls::DrawTestSpec::INDEXTYPE_BYTE,	true,	{ 0, 1, -1 } },
		{ gls::DrawTestSpec::STORAGE_USER,		gls::DrawTestSpec::INDEXTYPE_SHORT,	true,	{ 0, 2, -1 } },

		{ gls::DrawTestSpec::STORAGE_USER,		gls::DrawTestSpec::INDEXTYPE_SHORT,	false,	{ 1, 3, -1 } },

		{ gls::DrawTestSpec::STORAGE_BUFFER,	gls::DrawTestSpec::INDEXTYPE_BYTE,	true,	{ 0, 1, -1 } },
		{ gls::DrawTestSpec::STORAGE_BUFFER,	gls::DrawTestSpec::INDEXTYPE_SHORT,	true,	{ 0, 2, -1 } },
	};

	gls::DrawTestSpec spec;

	tcu::TestCaseGroup* userPtrGroup			= new tcu::TestCaseGroup(m_testCtx, "user_ptr", "user pointer");
	tcu::TestCaseGroup* unalignedUserPtrGroup	= new tcu::TestCaseGroup(m_testCtx, "unaligned_user_ptr", "unaligned user pointer");
	tcu::TestCaseGroup* bufferGroup				= new tcu::TestCaseGroup(m_testCtx, "buffer", "buffer");

	genBasicSpec(spec, m_method);

	this->addChild(userPtrGroup);
	this->addChild(unalignedUserPtrGroup);
	this->addChild(bufferGroup);

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
	{
		const IndexTest&				indexTest	= tests[testNdx];
		tcu::TestCaseGroup*				group		= (indexTest.storage == gls::DrawTestSpec::STORAGE_USER)
													? ((indexTest.aligned) ? (userPtrGroup) : (unalignedUserPtrGroup))
													: ((indexTest.aligned) ? (bufferGroup) : (DE_NULL));

		const std::string				name		= std::string("index_") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		const std::string				desc		= std::string("index ") + gls::DrawTestSpec::indexTypeToString(indexTest.type) + " in " + gls::DrawTestSpec::storageToString(indexTest.storage);
		de::MovePtr<gls::DrawTest>		test		(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), name.c_str(), desc.c_str()));

		spec.indexType			= indexTest.type;
		spec.indexStorage		= indexTest.storage;

		for (int iterationNdx = 0; iterationNdx < DE_LENGTH_OF_ARRAY(indexTest.offsets) && indexTest.offsets[iterationNdx] != -1; ++iterationNdx)
		{
			const std::string iterationDesc = std::string("offset ") + de::toString(indexTest.offsets[iterationNdx]);
			spec.indexPointerOffset	= indexTest.offsets[iterationNdx];
			test->addIteration(spec, iterationDesc.c_str());
		}

		DE_ASSERT(spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET);
		DE_ASSERT(spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE);
		group->addChild(test.release());
	}
}